

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesCommand.cxx
# Opt level: O0

string * FindInstallSource_abi_cxx11_
                   (string *__return_storage_ptr__,cmMakefile *makefile,char *name)

{
  cmAlphaNum *this;
  char *pcVar1;
  bool bVar2;
  size_type sVar3;
  string *psVar4;
  bool bVar5;
  cmAlphaNum local_158;
  cmAlphaNum local_128;
  undefined1 local_f8 [8];
  string ts;
  cmAlphaNum local_a8;
  undefined1 local_78 [8];
  string tb;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *name_local;
  cmMakefile *makefile_local;
  
  local_20 = name;
  name_local = (char *)makefile;
  makefile_local = (cmMakefile *)__return_storage_ptr__;
  bVar2 = cmsys::SystemTools::FileIsFullPath(name);
  pcVar1 = local_20;
  tb.field_2._M_local_buf[0xb] = '\0';
  bVar5 = true;
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pcVar1,&local_41);
    tb.field_2._M_local_buf[0xb] = '\x01';
    sVar3 = cmGeneratorExpression::Find(&local_40);
    bVar5 = sVar3 == 0;
  }
  if ((tb.field_2._M_local_buf[0xb] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (!bVar2) {
    std::allocator<char>::~allocator(&local_41);
  }
  pcVar1 = local_20;
  if (bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar1,
               (allocator<char> *)(tb.field_2._M_local_buf + 10));
    std::allocator<char>::~allocator((allocator<char> *)(tb.field_2._M_local_buf + 10));
  }
  else {
    psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((cmMakefile *)name_local);
    cmAlphaNum::cmAlphaNum(&local_a8,psVar4);
    this = (cmAlphaNum *)((long)&ts.field_2 + 8);
    cmAlphaNum::cmAlphaNum(this,'/');
    cmStrCat<char_const*>((string *)local_78,&local_a8,this,&local_20);
    psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((cmMakefile *)name_local);
    cmAlphaNum::cmAlphaNum(&local_128,psVar4);
    cmAlphaNum::cmAlphaNum(&local_158,'/');
    cmStrCat<char_const*>((string *)local_f8,&local_128,&local_158,&local_20);
    bVar5 = cmsys::SystemTools::FileExists((string *)local_78);
    if (bVar5) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_78);
    }
    else {
      bVar5 = cmsys::SystemTools::FileExists((string *)local_f8);
      if (bVar5) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_f8);
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_78);
      }
    }
    std::__cxx11::string::~string((string *)local_f8);
    std::__cxx11::string::~string((string *)local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string FindInstallSource(cmMakefile& makefile, const char* name)
{
  if (cmSystemTools::FileIsFullPath(name) ||
      cmGeneratorExpression::Find(name) == 0) {
    // This is a full path.
    return name;
  }

  // This is a relative path.
  std::string tb = cmStrCat(makefile.GetCurrentBinaryDirectory(), '/', name);
  std::string ts = cmStrCat(makefile.GetCurrentSourceDirectory(), '/', name);

  if (cmSystemTools::FileExists(tb)) {
    // The file exists in the binary tree.  Use it.
    return tb;
  }
  if (cmSystemTools::FileExists(ts)) {
    // The file exists in the source tree.  Use it.
    return ts;
  }
  // The file doesn't exist.  Assume it will be present in the
  // binary tree when the install occurs.
  return tb;
}